

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int parse_schema_nodeid(char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,
                       int *is_relative,int *has_predicate,int *all_desc,int extended)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x3b7,
                  "int parse_schema_nodeid(const char *, const char **, int *, const char **, int *, int *, int *, int *, int)"
                 );
  }
  if (is_relative != (int *)0x0) {
    if (has_predicate != (int *)0x0) {
      *has_predicate = 0;
    }
    if (*id == '/') {
      if (*is_relative == -1) {
        *is_relative = 0;
      }
      id = id + 1;
      uVar2 = 1;
    }
    else {
      if (*is_relative != -1) {
        return 0;
      }
      *is_relative = 1;
      uVar2 = 0;
      if (*id == '.') {
        uVar2 = (uint)(id[1] == '/') * 2;
        id = id + uVar2;
      }
    }
    uVar1 = parse_node_identifier(id,mod_name,mod_name_len,name,nam_len,all_desc,extended);
    if ((int)uVar1 < 1) {
      iVar3 = uVar1 - uVar2;
    }
    else {
      iVar3 = uVar2 + uVar1;
      if ((has_predicate != (int *)0x0) && (id[uVar1] == '[')) {
        *has_predicate = 1;
      }
    }
    return iVar3;
  }
  __assert_fail("is_relative",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                ,0x3b8,
                "int parse_schema_nodeid(const char *, const char **, int *, const char **, int *, int *, int *, int *, int)"
               );
}

Assistant:

int
parse_schema_nodeid(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                    int *is_relative, int *has_predicate, int *all_desc, int extended)
{
    int parsed = 0, ret;

    assert(id);
    assert(is_relative);

    if (has_predicate) {
        *has_predicate = 0;
    }

    if (id[0] != '/') {
        if (*is_relative != -1) {
            return -parsed;
        } else {
            *is_relative = 1;
        }
        if (!strncmp(id, "./", 2)) {
            parsed += 2;
            id += 2;
        }
    } else {
        if (*is_relative == -1) {
            *is_relative = 0;
        }
        ++parsed;
        ++id;
    }

    if ((ret = parse_node_identifier(id, mod_name, mod_name_len, name, nam_len, all_desc, extended)) < 1) {
        return -parsed + ret;
    }

    parsed += ret;
    id += ret;

    if ((id[0] == '[') && has_predicate) {
        *has_predicate = 1;
    }

    return parsed;
}